

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_requirements(App *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ExcludesError *pEVar5;
  RequiresError *pRVar6;
  pointer pOVar7;
  reference ppOVar8;
  size_type sVar9;
  RequiredError *pRVar10;
  element_type *peVar11;
  string local_498;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_478;
  App_p *sub_1;
  iterator __end2_6;
  iterator __begin2_6;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_6;
  string local_450 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  anon_class_1_0_00000001 local_3e1;
  function<bool_(CLI::App_*)> local_3e0;
  undefined1 local_3c0 [8];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> subc_list;
  string local_3a0 [40];
  undefined1 local_378 [8];
  string option_list;
  App_p *sub;
  iterator __end2_5;
  iterator __begin2_5;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_5;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  string local_318;
  string local_2f8;
  Option *local_2d8;
  Option *opt_ex;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  string local_2b0;
  string local_290;
  Option *local_270;
  Option *opt_req;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  string local_248;
  reference local_228;
  Option_p *opt_2;
  iterator __end2_4;
  iterator __begin2_4;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_4;
  size_t used_options;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  reference local_198;
  App **subc_1;
  iterator __end2_3;
  iterator __begin2_3;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *__range2_3;
  reference local_158;
  Option **opt_1;
  iterator __end2_2;
  iterator __begin2_2;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2_2;
  string missing_need;
  bool missing_needed;
  string local_108;
  string local_e8;
  string local_c8;
  reference local_a8;
  App **subc;
  iterator __end2_1;
  iterator __begin2_1;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *__range2_1;
  string local_78;
  reference local_58;
  Option **opt;
  iterator __end2;
  iterator __begin2;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2;
  string excluder;
  bool excluded;
  App *this_local;
  
  excluder.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)&__range2);
  __end2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                     (&this->exclude_options_);
  opt = (Option **)
        std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                  (&this->exclude_options_);
  while (bVar2 = std::operator==(&__end2,(_Self *)&opt), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_58 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end2);
    sVar4 = Option::count(*local_58);
    if (sVar4 != 0) {
      excluder.field_2._M_local_buf[0xf] = '\x01';
      Option::get_name_abi_cxx11_(&local_78,*local_58,false,false);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 &local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end2);
  }
  __end2_1 = std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::begin
                       (&this->exclude_subcommands_);
  subc = (App **)std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::end
                           (&this->exclude_subcommands_);
  while (bVar2 = std::operator==(&__end2_1,(_Self *)&subc), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_a8 = std::_Rb_tree_const_iterator<CLI::App_*>::operator*(&__end2_1);
    sVar4 = count_all(*local_a8);
    if (sVar4 != 0) {
      excluder.field_2._M_local_buf[0xf] = '\x01';
      get_display_name_abi_cxx11_(&local_c8,*local_a8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 &local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
    }
    std::_Rb_tree_const_iterator<CLI::App_*>::operator++(&__end2_1);
  }
  if ((excluder.field_2._M_local_buf[0xf] & 1U) == 0) {
    missing_need.field_2._M_local_buf[0xf] = '\0';
    ::std::__cxx11::string::string((string *)&__range2_2);
    __end2_2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin(&this->need_options_);
    opt_1 = (Option **)
            std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                      (&this->need_options_);
    while (bVar2 = std::operator==(&__end2_2,(_Self *)&opt_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_158 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end2_2);
      sVar4 = Option::count(*local_158);
      if (sVar4 == 0) {
        missing_need.field_2._M_local_buf[0xf] = '\x01';
        Option::get_name_abi_cxx11_((string *)&__range2_3,*local_158,false,false);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_3)
        ;
        ::std::__cxx11::string::~string((string *)&__range2_3);
      }
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end2_2);
    }
    __end2_3 = std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::begin
                         (&this->need_subcommands_);
    subc_1 = (App **)std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::end
                               (&this->need_subcommands_);
    while (bVar2 = std::operator==(&__end2_3,(_Self *)&subc_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_198 = std::_Rb_tree_const_iterator<CLI::App_*>::operator*(&__end2_3);
      sVar4 = count_all(*local_198);
      if (sVar4 == 0) {
        missing_need.field_2._M_local_buf[0xf] = '\x01';
        get_display_name_abi_cxx11_(&local_1b8,*local_198);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_2,
                   &local_1b8);
        ::std::__cxx11::string::~string((string *)&local_1b8);
      }
      std::_Rb_tree_const_iterator<CLI::App_*>::operator++(&__end2_3);
    }
    if ((missing_need.field_2._M_local_buf[0xf] & 1U) == 0) {
      __range2_4 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    *)0x0;
      __end2_4 = std::
                 vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                 ::begin(&this->options_);
      opt_2 = (Option_p *)
              std::
              vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ::end(&this->options_);
      while (bVar2 = __gnu_cxx::
                     operator==<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               (&__end2_4,
                                (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                 *)&opt_2), ((bVar2 ^ 0xffU) & 1) != 0) {
        local_228 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                    ::operator*(&__end2_4);
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_228);
        sVar4 = Option::count(pOVar7);
        if (sVar4 != 0) {
          __range2_4 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                        *)((long)&(__range2_4->
                                  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
        }
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_228);
        bVar2 = OptionBase<CLI::Option>::get_required(&pOVar7->super_OptionBase<CLI::Option>);
        if (bVar2) {
          pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_228);
          sVar4 = Option::count(pOVar7);
          if (sVar4 == 0) {
            pRVar10 = (RequiredError *)__cxa_allocate_exception(0x38);
            pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_228);
            Option::get_name_abi_cxx11_(&local_248,pOVar7,false,false);
            RequiredError::RequiredError(pRVar10,&local_248);
            __cxa_throw(pRVar10,&RequiredError::typeinfo,RequiredError::~RequiredError);
          }
        }
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_228);
        __end3 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
                 begin(&pOVar7->needs_);
        opt_req = (Option *)
                  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                  ::end(&pOVar7->needs_);
        while (bVar2 = std::operator==(&__end3,(_Self *)&opt_req), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppOVar8 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3);
          local_270 = *ppOVar8;
          pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_228);
          sVar4 = Option::count(pOVar7);
          if ((sVar4 != 0) && (sVar4 = Option::count(local_270), sVar4 == 0)) {
            pRVar6 = (RequiresError *)__cxa_allocate_exception(0x38);
            pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_228);
            Option::get_name_abi_cxx11_(&local_290,pOVar7,false,false);
            Option::get_name_abi_cxx11_(&local_2b0,local_270,false,false);
            RequiresError::RequiresError(pRVar6,&local_290,&local_2b0);
            __cxa_throw(pRVar6,&RequiresError::typeinfo,RequiresError::~RequiresError);
          }
          std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3);
        }
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_228);
        __end3_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                   ::begin(&pOVar7->excludes_);
        opt_ex = (Option *)
                 std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
                 end(&pOVar7->excludes_);
        while (bVar2 = std::operator==(&__end3_1,(_Self *)&opt_ex), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppOVar8 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3_1);
          local_2d8 = *ppOVar8;
          pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_228);
          sVar4 = Option::count(pOVar7);
          if ((sVar4 != 0) && (sVar4 = Option::count(local_2d8), sVar4 != 0)) {
            selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            pEVar5 = (ExcludesError *)__cxa_allocate_exception(0x38);
            pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_228);
            Option::get_name_abi_cxx11_(&local_2f8,pOVar7,false,false);
            Option::get_name_abi_cxx11_(&local_318,local_2d8,false,false);
            ExcludesError::ExcludesError(pEVar5,&local_2f8,&local_318);
            selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            __cxa_throw(pEVar5,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
          }
          std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3_1);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&__end2_4);
      }
      if (this->require_subcommand_min_ != 0) {
        get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__range2_5,this);
        uVar1 = this->require_subcommand_min_;
        sVar9 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                          ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__range2_5);
        if (sVar9 < uVar1) {
          pRVar10 = (RequiredError *)__cxa_allocate_exception(0x38);
          RequiredError::Subcommand(pRVar10,this->require_subcommand_min_);
          __cxa_throw(pRVar10,&RequiredError::typeinfo,RequiredError::~RequiredError);
        }
        std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
                  ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__range2_5);
      }
      __end2_5 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::begin(&this->subcommands_);
      sub = (App_p *)std::
                     vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ::end(&this->subcommands_);
      while (bVar2 = __gnu_cxx::
                     operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               (&__end2_5,
                                (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                 *)&sub), ((bVar2 ^ 0xffU) & 1) != 0) {
        option_list.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
             ::operator*(&__end2_5);
        peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)option_list.field_2._8_8_);
        if ((peVar11->disabled_ & 1U) == 0) {
          peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)option_list.field_2._8_8_);
          bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty(&peVar11->name_);
          if (bVar2) {
            peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)option_list.field_2._8_8_);
            sVar4 = count_all(peVar11);
            if (sVar4 != 0) {
              __range2_4 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                            *)((long)&(__range2_4->
                                      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
        ::operator++(&__end2_5);
      }
      if ((__range2_4 <
           (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            *)this->require_option_min_) ||
         ((this->require_option_max_ != 0 &&
          ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            *)this->require_option_max_ < __range2_4)))) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  (local_3a0,",",
                   (allocator<char> *)
                   ((long)&subc_list.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        detail::
        join<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>,CLI::App::_process_requirements()::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_,void>
                  (local_378,(detail *)&this->options_,local_3a0);
        ::std::__cxx11::string::~string(local_3a0);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&subc_list.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_378,0,10,"-h,--help,");
        if (iVar3 == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     0,10);
        }
        ::std::function<bool(CLI::App*)>::
        function<CLI::App::_process_requirements()::_lambda(CLI::App*)_1_,void>
                  ((function<bool(CLI::App*)> *)&local_3e0,&local_3e1);
        get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_3c0,this,&local_3e0
                       );
        std::function<bool_(CLI::App_*)>::~function(&local_3e0);
        bVar2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                          ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_3c0);
        if (!bVar2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    (local_450,",",(allocator<char> *)((long)&__range2_6 + 7));
          detail::
          join<std::vector<CLI::App*,std::allocator<CLI::App*>>,CLI::App::_process_requirements()::_lambda(CLI::App_const*)_1_,void>
                    (&local_428,(detail *)local_3c0,local_450);
          ::std::operator+(&local_408,",",&local_428);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     &local_408);
          ::std::__cxx11::string::~string((string *)&local_408);
          ::std::__cxx11::string::~string((string *)&local_428);
          ::std::__cxx11::string::~string(local_450);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_6 + 7));
        }
        pRVar10 = (RequiredError *)__cxa_allocate_exception(0x38);
        RequiredError::Option
                  (pRVar10,this->require_option_min_,this->require_option_max_,(size_t)__range2_4,
                   (string *)local_378);
        __cxa_throw(pRVar10,&RequiredError::typeinfo,RequiredError::~RequiredError);
      }
      __end2_6 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::begin(&this->subcommands_);
      sub_1 = (App_p *)std::
                       vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       ::end(&this->subcommands_);
      while (bVar2 = __gnu_cxx::
                     operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               (&__end2_6,
                                (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                 *)&sub_1), ((bVar2 ^ 0xffU) & 1) != 0) {
        local_478 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    __gnu_cxx::
                    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                    ::operator*(&__end2_6);
        peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(local_478);
        if ((peVar11->disabled_ & 1U) == 0) {
          peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(local_478);
          bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty(&peVar11->name_);
          if ((bVar2) &&
             (peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_478), (peVar11->required_ & 1U) == 0)) {
            peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_478);
            sVar4 = count_all(peVar11);
            if ((sVar4 == 0) &&
               (((this->require_option_min_ != 0 &&
                 ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   *)this->require_option_min_ <= __range2_4)) ||
                ((this->require_option_max_ != 0 &&
                 ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   *)this->require_option_min_ <= __range2_4)))))) goto LAB_001427cd;
          }
          peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(local_478);
          sVar4 = count(peVar11);
          if (sVar4 == 0) {
            peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_478);
            bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty(&peVar11->name_);
            if (bVar2) goto LAB_001426c0;
          }
          else {
LAB_001426c0:
            peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_478);
            _process_requirements(peVar11);
          }
          peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(local_478);
          if ((peVar11->required_ & 1U) != 0) {
            peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_478);
            sVar4 = count_all(peVar11);
            if (sVar4 == 0) {
              pRVar10 = (RequiredError *)__cxa_allocate_exception(0x38);
              peVar11 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_478);
              get_display_name_abi_cxx11_(&local_498,peVar11);
              RequiredError::RequiredError(pRVar10,&local_498);
              __cxa_throw(pRVar10,&RequiredError::typeinfo,RequiredError::~RequiredError);
            }
          }
        }
LAB_001427cd:
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
        ::operator++(&__end2_6);
      }
    }
    else {
      sVar4 = count_all(this);
      if (sVar4 != 0) {
        pRVar6 = (RequiresError *)__cxa_allocate_exception(0x38);
        get_display_name_abi_cxx11_(&local_1d8,this);
        ::std::__cxx11::string::string
                  ((string *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_2)
        ;
        RequiresError::RequiresError(pRVar6,&local_1d8,&local_1f8);
        __cxa_throw(pRVar6,&RequiresError::typeinfo,RequiresError::~RequiresError);
      }
    }
    ::std::__cxx11::string::~string((string *)&__range2_2);
  }
  else {
    sVar4 = count_all(this);
    if (sVar4 != 0) {
      pEVar5 = (ExcludesError *)__cxa_allocate_exception(0x38);
      get_display_name_abi_cxx11_(&local_e8,this);
      ::std::__cxx11::string::string
                ((string *)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
      ExcludesError::ExcludesError(pEVar5,&local_e8,&local_108);
      __cxa_throw(pEVar5,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
    }
  }
  ::std::__cxx11::string::~string((string *)&__range2);
  return;
}

Assistant:

void _process_requirements() {
        // check excludes
        bool excluded{false};
        std::string excluder;
        for(auto &opt : exclude_options_) {
            if(opt->count() > 0) {
                excluded = true;
                excluder = opt->get_name();
            }
        }
        for(auto &subc : exclude_subcommands_) {
            if(subc->count_all() > 0) {
                excluded = true;
                excluder = subc->get_display_name();
            }
        }
        if(excluded) {
            if(count_all() > 0) {
                throw ExcludesError(get_display_name(), excluder);
            }
            // if we are excluded but didn't receive anything, just return
            return;
        }

        // check excludes
        bool missing_needed{false};
        std::string missing_need;
        for(auto &opt : need_options_) {
            if(opt->count() == 0) {
                missing_needed = true;
                missing_need = opt->get_name();
            }
        }
        for(auto &subc : need_subcommands_) {
            if(subc->count_all() == 0) {
                missing_needed = true;
                missing_need = subc->get_display_name();
            }
        }
        if(missing_needed) {
            if(count_all() > 0) {
                throw RequiresError(get_display_name(), missing_need);
            }
            // if we missing something but didn't have any options, just return
            return;
        }

        std::size_t used_options = 0;
        for(const Option_p &opt : options_) {

            if(opt->count() != 0) {
                ++used_options;
            }
            // Required but empty
            if(opt->get_required() && opt->count() == 0) {
                throw RequiredError(opt->get_name());
            }
            // Requires
            for(const Option *opt_req : opt->needs_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->get_name(), opt_req->get_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->get_name(), opt_ex->get_name());
        }
        // check for the required number of subcommands
        if(require_subcommand_min_ > 0) {
            auto selected_subcommands = get_subcommands();
            if(require_subcommand_min_ > selected_subcommands.size())
                throw RequiredError::Subcommand(require_subcommand_min_);
        }

        // Max error cannot occur, the extra subcommand will parse as an ExtrasError or a remaining item.

        // run this loop to check how many unnamed subcommands were actually used since they are considered options
        // from the perspective of an App
        for(App_p &sub : subcommands_) {
            if(sub->disabled_)
                continue;
            if(sub->name_.empty() && sub->count_all() > 0) {
                ++used_options;
            }
        }

        if(require_option_min_ > used_options || (require_option_max_ > 0 && require_option_max_ < used_options)) {
            auto option_list = detail::join(options_, [](const Option_p &ptr) { return ptr->get_name(false, true); });
            if(option_list.compare(0, 10, "-h,--help,") == 0) {
                option_list.erase(0, 10);
            }
            auto subc_list = get_subcommands([](App *app) { return ((app->get_name().empty()) && (!app->disabled_)); });
            if(!subc_list.empty()) {
                option_list += "," + detail::join(subc_list, [](const App *app) { return app->get_display_name(); });
            }
            throw RequiredError::Option(require_option_min_, require_option_max_, used_options, option_list);
        }

        // now process the requirements for subcommands if needed
        for(App_p &sub : subcommands_) {
            if(sub->disabled_)
                continue;
            if(sub->name_.empty() && sub->required_ == false) {
                if(sub->count_all() == 0) {
                    if(require_option_min_ > 0 && require_option_min_ <= used_options) {
                        continue;
                        // if we have met the requirement and there is nothing in this option group skip checking
                        // requirements
                    }
                    if(require_option_max_ > 0 && used_options >= require_option_min_) {
                        continue;
                        // if we have met the requirement and there is nothing in this option group skip checking
                        // requirements
                    }
                }
            }
            if(sub->count() > 0 || sub->name_.empty()) {
                sub->_process_requirements();
            }

            if(sub->required_ && sub->count_all() == 0) {
                throw(CLI::RequiredError(sub->get_display_name()));
            }
        }
    }